

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calculator.cpp
# Opt level: O1

double __thiscall Calculator::value(Calculator *this,Token *t)

{
  int iVar1;
  double def;
  double local_10;
  
  local_10 = 0.0;
  if (t->type == NAME) {
    iVar1 = asl::Map<asl::String,_double>::indexOf
                      (&(this->_variables).super_Map<asl::String,_double>,&t->val);
    t = (Token *)&stack0xfffffffffffffff0;
    if (-1 < iVar1) {
      t = (Token *)&(this->_variables).super_Map<asl::String,_double>.a._a[iVar1].value;
    }
  }
  return t->x;
}

Assistant:

double Calculator::value(const Calculator::Token& t) const
{
	double def = 0.0;
	return (t.type == NAME)? _variables.get(t.val, def) : t.x;
}